

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::commandFinished
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessStatus commandResult)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t
  *UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  UNRECOVERED_JUMPTABLE = (this->cAPIDelegate).command_finished;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)0x0) {
    pvVar1 = (this->cAPIDelegate).context;
    get_command_result(commandResult);
    (*UNRECOVERED_JUMPTABLE)(pvVar1,(llb_buildsystem_command_t *)command,commandResult);
    return;
  }
  return;
}

Assistant:

virtual void commandFinished(Command* command, ProcessStatus commandResult) override {
    if (cAPIDelegate.command_finished) {
      cAPIDelegate.command_finished(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          get_command_result(commandResult));
    }
  }